

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.h
# Opt level: O0

void __thiscall
icu_63::DecimalFormatSymbols::setSymbol
          (DecimalFormatSymbols *this,ENumberFormatSymbol symbol,UnicodeString *value,
          UBool propogateDigits)

{
  int32_t iVar1;
  UnicodeString local_70;
  char local_29;
  UChar32 local_28;
  int8_t i;
  UChar32 sym;
  UBool propogateDigits_local;
  UnicodeString *value_local;
  DecimalFormatSymbols *pDStack_10;
  ENumberFormatSymbol symbol_local;
  DecimalFormatSymbols *this_local;
  
  if (symbol == kCurrencySymbol) {
    this->fIsCustomCurrencySymbol = '\x01';
  }
  else if (symbol == kIntlCurrencySymbol) {
    this->fIsCustomIntlCurrencySymbol = '\x01';
  }
  i = propogateDigits;
  _sym = value;
  value_local._4_4_ = symbol;
  pDStack_10 = this;
  if ((int)symbol < 0x1c) {
    UnicodeString::operator=((UnicodeString *)(&this->field_0x8 + (ulong)symbol * 0x40),value);
  }
  if (value_local._4_4_ == kZeroDigitSymbol) {
    local_28 = UnicodeString::char32At(_sym,0);
    if (((i == '\0') || (iVar1 = u_charDigitValue_63(local_28), iVar1 != 0)) ||
       (iVar1 = UnicodeString::countChar32(_sym,0,0x7fffffff), iVar1 != 1)) {
      this->fCodePointZero = -1;
    }
    else {
      this->fCodePointZero = local_28;
      for (local_29 = '\x01'; local_29 < '\n'; local_29 = local_29 + '\x01') {
        local_28 = local_28 + 1;
        UnicodeString::UnicodeString(&local_70,local_28);
        UnicodeString::operator=
                  ((UnicodeString *)(&this->field_0x8 + (long)(local_29 + 0x11) * 0x40),&local_70);
        UnicodeString::~UnicodeString(&local_70);
      }
    }
  }
  else if ((0x11 < (int)value_local._4_4_) && ((int)value_local._4_4_ < 0x1b)) {
    this->fCodePointZero = -1;
  }
  return;
}

Assistant:

inline void
DecimalFormatSymbols::setSymbol(ENumberFormatSymbol symbol, const UnicodeString &value, const UBool propogateDigits = TRUE) {
    if (symbol == kCurrencySymbol) {
        fIsCustomCurrencySymbol = TRUE;
    }
    else if (symbol == kIntlCurrencySymbol) {
        fIsCustomIntlCurrencySymbol = TRUE;
    }
    if(symbol<kFormatSymbolCount) {
        fSymbols[symbol]=value;
    }

    // If the zero digit is being set to a known zero digit according to Unicode,
    // then we automatically set the corresponding 1-9 digits
    // Also record updates to fCodePointZero. Be conservative if in doubt.
    if (symbol == kZeroDigitSymbol) {
        UChar32 sym = value.char32At(0);
        if ( propogateDigits && u_charDigitValue(sym) == 0 && value.countChar32() == 1 ) {
            fCodePointZero = sym;
            for ( int8_t i = 1 ; i<= 9 ; i++ ) {
                sym++;
                fSymbols[(int)kOneDigitSymbol+i-1] = UnicodeString(sym);
            }
        } else {
            fCodePointZero = -1;
        }
    } else if (symbol >= kOneDigitSymbol && symbol <= kNineDigitSymbol) {
        fCodePointZero = -1;
    }
}